

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateGroupNonUniformBallotBitCount
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint32_t uVar2;
  DiagnosticStream *pDVar3;
  Instruction *this;
  spv_const_context psVar4;
  string local_5e0;
  DiagnosticStream local_5c0;
  GroupOperation local_3e4;
  undefined1 local_3e0 [4];
  GroupOperation group;
  uint32_t local_208;
  uint local_204;
  uint32_t value_type;
  uint value;
  uint32_t local_24;
  Instruction *pIStack_20;
  uint32_t result_type;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  local_24 = val::Instruction::type_id(inst);
  bVar1 = ValidationState_t::IsUnsignedIntScalarType((ValidationState_t *)inst_local,local_24);
  if (bVar1) {
    local_204 = val::Instruction::GetOperandAs<unsigned_int>(pIStack_20,4);
    this = ValidationState_t::FindDef((ValidationState_t *)inst_local,local_204);
    local_208 = val::Instruction::type_id(this);
    bVar1 = ValidationState_t::IsUnsignedIntVectorType((ValidationState_t *)inst_local,local_208);
    if ((bVar1) &&
       (uVar2 = ValidationState_t::GetDimension((ValidationState_t *)inst_local,local_208),
       uVar2 == 4)) {
      local_3e4 = val::Instruction::GetOperandAs<spv::GroupOperation>(pIStack_20,3);
      psVar4 = ValidationState_t::context((ValidationState_t *)inst_local);
      bVar1 = spvIsVulkanEnv(psVar4->target_env);
      if ((bVar1) &&
         (((local_3e4 != GroupOperationReduce && (local_3e4 != GroupOperationInclusiveScan)) &&
          (local_3e4 != ExclusiveScan)))) {
        ValidationState_t::diag
                  (&local_5c0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,pIStack_20);
        ValidationState_t::VkErrorID_abi_cxx11_
                  (&local_5e0,(ValidationState_t *)inst_local,0x124d,(char *)0x0);
        pDVar3 = DiagnosticStream::operator<<(&local_5c0,&local_5e0);
        pDVar3 = DiagnosticStream::operator<<
                           (pDVar3,(char (*) [118])
                                   "In Vulkan: The OpGroupNonUniformBallotBitCount group operation must be only: Reduce, InclusiveScan, or ExclusiveScan."
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        std::__cxx11::string::~string((string *)&local_5e0);
        DiagnosticStream::~DiagnosticStream(&local_5c0);
      }
      else {
        __local._4_4_ = SPV_SUCCESS;
      }
    }
    else {
      ValidationState_t::diag
                ((DiagnosticStream *)local_3e0,(ValidationState_t *)inst_local,
                 SPV_ERROR_INVALID_DATA,pIStack_20);
      pDVar3 = DiagnosticStream::operator<<
                         ((DiagnosticStream *)local_3e0,
                          (char (*) [72])
                          "Expected Value to be a vector of four components of integer type scalar")
      ;
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3e0);
    }
  }
  else {
    ValidationState_t::diag
              ((DiagnosticStream *)&value_type,(ValidationState_t *)inst_local,
               SPV_ERROR_INVALID_DATA,pIStack_20);
    pDVar3 = DiagnosticStream::operator<<
                       ((DiagnosticStream *)&value_type,
                        (char (*) [60])"Expected Result Type to be an unsigned integer type scalar."
                       );
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&value_type);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateGroupNonUniformBallotBitCount(ValidationState_t& _,
                                                   const Instruction* inst) {
  // Scope is already checked by ValidateExecutionScope() above.

  const uint32_t result_type = inst->type_id();
  if (!_.IsUnsignedIntScalarType(result_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Result Type to be an unsigned integer type scalar.";
  }

  const auto value = inst->GetOperandAs<uint32_t>(4);
  const auto value_type = _.FindDef(value)->type_id();
  if (!_.IsUnsignedIntVectorType(value_type) ||
      _.GetDimension(value_type) != 4) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst) << "Expected Value to be a "
                                                   "vector of four components "
                                                   "of integer type scalar";
  }

  const auto group = inst->GetOperandAs<spv::GroupOperation>(3);
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if ((group != spv::GroupOperation::Reduce) &&
        (group != spv::GroupOperation::InclusiveScan) &&
        (group != spv::GroupOperation::ExclusiveScan)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4685)
             << "In Vulkan: The OpGroupNonUniformBallotBitCount group "
                "operation must be only: Reduce, InclusiveScan, or "
                "ExclusiveScan.";
    }
  }
  return SPV_SUCCESS;
}